

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

QListViewItem * __thiscall
QListModeViewBase::indexToListViewItem
          (QListViewItem *__return_storage_ptr__,QListModeViewBase *this,QModelIndex *index)

{
  uint uVar1;
  QListView *pQVar2;
  QListViewPrivate *pQVar3;
  int *piVar4;
  QWidgetData *pQVar5;
  short sVar6;
  Representation RVar7;
  QSize QVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  QSize *pQVar13;
  Representation RVar14;
  int iVar15;
  long in_FS_OFFSET;
  QStyleOptionViewItem local_100;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar12 = (this->flowPositions).d.size;
  if (((lVar12 == 0) || ((this->segmentPositions).d.size == 0)) || (lVar12 + -1 <= (long)index->r))
  {
    __return_storage_ptr__->x = -1;
    __return_storage_ptr__->y = -1;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->indexHint = -1;
    __return_storage_ptr__->visited = 0xffff;
  }
  else {
    iVar15 = (int)(this->segmentStartRows).d.size;
    iVar11 = iVar15 + -1;
    iVar15 = iVar15 >> 1;
    if (0 < iVar11) {
      iVar9 = 0;
      do {
        iVar10 = iVar15;
        if (index->r < (this->segmentStartRows).d.ptr[iVar15]) {
          iVar11 = iVar15 + -1;
          iVar10 = iVar9;
        }
        iVar15 = iVar11 + iVar10 + 1 >> 1;
        iVar9 = iVar10;
      } while (iVar10 < iVar11);
    }
    memset(&local_100,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_100);
    pQVar2 = (this->super_QCommonListViewBase).qq;
    (**(code **)(*(long *)&(pQVar2->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(pQVar2,&local_100);
    QVar8 = (this->super_QCommonListViewBase).contentsSize;
    local_100.super_QStyleOption.rect.x2.m_i =
         local_100.super_QStyleOption.rect.x1.m_i + QVar8.wd.m_i.m_i + -1;
    local_100.super_QStyleOption.rect.y2.m_i =
         local_100.super_QStyleOption.rect.y1.m_i + QVar8.ht.m_i.m_i + -1;
    pQVar3 = (this->super_QCommonListViewBase).dd;
    if ((pQVar3->uniformItemSizes != true) ||
       (QVar8 = pQVar3->cachedItemSize, ((ulong)QVar8 & 0x8000000080000000) != 0)) {
      QVar8 = QListViewPrivate::itemSize(pQVar3,&local_100,index);
    }
    pQVar3 = (this->super_QCommonListViewBase).dd;
    iVar11 = (this->flowPositions).d.ptr[index->r];
    lVar12 = (long)iVar15;
    piVar4 = (this->segmentPositions).d.ptr;
    iVar15 = piVar4[lVar12];
    RVar7 = QVar8.wd.m_i;
    iVar9 = iVar15;
    RVar14.m_i = RVar7.m_i;
    if (pQVar3->flow != LeftToRight) {
      iVar9 = iVar11;
      iVar11 = iVar15;
      if (pQVar3->wrap == true) {
        pQVar13 = (QSize *)(piVar4 + lVar12 + 1);
        if ((this->segmentPositions).d.size <= lVar12 + 1) {
          pQVar13 = &(this->super_QCommonListViewBase).contentsSize;
        }
        RVar14.m_i = (pQVar13->wd).m_i - iVar15;
      }
      else {
        pQVar5 = ((pQVar3->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport
                 )->data;
        RVar14.m_i = ((pQVar5->crect).x2.m_i - (pQVar3->space * 2 + (pQVar5->crect).x1.m_i)) + 1;
        if (RVar14.m_i <= RVar7.m_i) {
          RVar14.m_i = RVar7.m_i;
        }
      }
    }
    uVar1 = (pQVar3->itemAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i;
    iVar15 = RVar14.m_i;
    if ((uVar1 & 0x1f) != 0) {
      if (RVar14.m_i < RVar7.m_i) {
        RVar7.m_i = RVar14.m_i;
      }
      if ((uVar1 & 2) != 0) {
        iVar11 = (RVar14.m_i + iVar11) - RVar7.m_i;
      }
      iVar15 = RVar7.m_i;
      if ((uVar1 & 4) != 0) {
        iVar11 = iVar11 + (RVar14.m_i - RVar7.m_i) / 2;
      }
    }
    iVar10 = index->r;
    __return_storage_ptr__->x = iVar11;
    __return_storage_ptr__->y = iVar9;
    sVar6 = (short)iVar15;
    if (0x7ffe < iVar15) {
      sVar6 = 0x7fff;
    }
    __return_storage_ptr__->w = sVar6;
    RVar14.m_i = 0x7fff;
    if (QVar8.ht.m_i.m_i < 0x7fff) {
      RVar14.m_i = QVar8.ht.m_i.m_i;
    }
    __return_storage_ptr__->h = (short)RVar14.m_i;
    __return_storage_ptr__->indexHint = iVar10;
    __return_storage_ptr__->visited = 0xffff;
    QBrush::~QBrush(&local_100.backgroundBrush);
    if (&(local_100.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_100.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_100.icon);
    QLocale::~QLocale(&local_100.locale);
    QFont::~QFont(&local_100.font);
    QStyleOption::~QStyleOption(&local_100.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QListViewItem QListModeViewBase::indexToListViewItem(const QModelIndex &index) const
{
    if (flowPositions.isEmpty()
        || segmentPositions.isEmpty()
        || index.row() >= flowPositions.size() - 1)
        return QListViewItem();

    const int segment = qBinarySearch<int>(segmentStartRows, index.row(),
                                           0, segmentStartRows.size() - 1);


    QStyleOptionViewItem options;
    initViewItemOption(&options);
    options.rect.setSize(contentsSize);
    QSize size = (uniformItemSizes() && cachedItemSize().isValid())
                 ? cachedItemSize() : itemSize(options, index);
    QSize cellSize = size;

    QPoint pos;
    if (flow() == QListView::LeftToRight) {
        pos.setX(flowPositions.at(index.row()));
        pos.setY(segmentPositions.at(segment));
    } else { // TopToBottom
        pos.setY(flowPositions.at(index.row()));
        pos.setX(segmentPositions.at(segment));
        if (isWrapping()) { // make the items as wide as the segment
            int right = (segment + 1 >= segmentPositions.size()
                     ? contentsSize.width()
                     : segmentPositions.at(segment + 1));
            cellSize.setWidth(right - pos.x());
        } else { // make the items as wide as the viewport
            cellSize.setWidth(qMax(size.width(), viewport()->width() - 2 * spacing()));
        }
    }

    if (dd->itemAlignment & Qt::AlignHorizontal_Mask) {
        size.setWidth(qMin(size.width(), cellSize.width()));
        if (dd->itemAlignment & Qt::AlignRight)
            pos.setX(pos.x() + cellSize.width() - size.width());
        if (dd->itemAlignment & Qt::AlignHCenter)
            pos.setX(pos.x() + (cellSize.width() - size.width()) / 2);
    } else {
        size.setWidth(cellSize.width());
    }

    return QListViewItem(QRect(pos, size), index.row());
}